

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl.cpp
# Opt level: O3

void __thiscall pg::DTLSolver::run(DTLSolver *this)

{
  bitset *this_00;
  uint64_t *puVar1;
  pointer ppiVar2;
  vector<int,_std::allocator<int>_> *pvVar3;
  pointer piVar4;
  void *pvVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  bool bVar8;
  ulong uVar9;
  ulong *puVar10;
  int *piVar11;
  uint *puVar12;
  uint *puVar13;
  ostream *poVar14;
  Error *this_01;
  long *plVar15;
  size_t sVar16;
  ulong uVar17;
  ulong uVar18;
  uint64_t uVar19;
  long lVar20;
  Game *pGVar21;
  int iVar22;
  int **x;
  pointer ppiVar23;
  pointer *ppiVar24;
  int iVar25;
  
  uVar18 = ((this->super_Solver).game)->n_vertices;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar18;
  uVar9 = SUB168(auVar6 * ZEXT816(0x18),0);
  uVar17 = uVar9 + 8;
  if (0xfffffffffffffff7 < uVar9) {
    uVar17 = 0xffffffffffffffff;
  }
  if (SUB168(auVar6 * ZEXT816(0x18),8) != 0) {
    uVar17 = 0xffffffffffffffff;
  }
  puVar10 = (ulong *)operator_new__(uVar17);
  *puVar10 = uVar18;
  if (uVar18 != 0) {
    memset((vector<int,_std::allocator<int>_> *)(puVar10 + 1),0,
           ((uVar9 - 0x18) / 0x18) * 0x18 + 0x18);
  }
  this->tin = (vector<int,_std::allocator<int>_> *)(puVar10 + 1);
  uVar9 = -(ulong)(uVar18 >> 0x3e != 0) | uVar18 << 2;
  piVar11 = (int *)operator_new__(uVar9);
  this->str = piVar11;
  piVar11 = (int *)operator_new__(uVar9);
  this->dvalue = piVar11;
  bitset::resize(&this->Z,uVar18);
  bitset::resize(&this->S,((this->super_Solver).game)->n_vertices);
  bitset::resize(&this->W,((this->super_Solver).game)->n_vertices);
  this_00 = &this->G;
  bitset::operator=(this_00,(this->super_Solver).disabled);
  if ((this->G)._bitssize == 0) {
    uVar18 = 0;
  }
  else {
    puVar1 = this_00->_bits;
    uVar9 = 0;
    do {
      puVar1[uVar9] = ~puVar1[uVar9];
      uVar9 = uVar9 + 1;
      uVar18 = (this->G)._bitssize;
    } while (uVar9 < uVar18);
  }
  uVar9 = (this->G)._size & 0x3f;
  if (uVar9 != 0) {
    this_00->_bits[uVar18 - 1] = this_00->_bits[uVar18 - 1] & ~(-1L << uVar9);
  }
  pGVar21 = (this->super_Solver).game;
  uVar18 = pGVar21->n_vertices;
  uVar9 = 0xffffffffffffffff;
  if (uVar18 < 0x4000000000000000) {
    uVar9 = uVar18 * 4;
  }
  piVar11 = (int *)operator_new__(uVar9);
  this->Candidates = piVar11;
  bitset::resize(&this->Player,pGVar21->n_vertices);
  pGVar21 = (this->super_Solver).game;
  uVar18 = pGVar21->n_vertices;
  if (0 < (long)uVar18) {
    piVar11 = pGVar21->_priority;
    puVar1 = (this->Player)._bits;
    uVar9 = 0;
    do {
      uVar18 = uVar9 >> 6;
      uVar17 = 1L << (uVar9 & 0x3f);
      if ((*(byte *)(piVar11 + uVar9) & 1) == 0) {
        uVar19 = ~uVar17 & puVar1[uVar18];
      }
      else {
        uVar19 = uVar17 | puVar1[uVar18];
      }
      puVar1[uVar18] = uVar19;
      uVar9 = uVar9 + 1;
      uVar18 = pGVar21->n_vertices;
    } while ((long)uVar9 < (long)uVar18);
  }
  (this->Q).pointer = 0;
  puVar12 = (this->Q).queue;
  if (puVar12 != (uint *)0x0) {
    operator_delete__(puVar12);
    pGVar21 = (this->super_Solver).game;
  }
  puVar12 = (uint *)operator_new__((uVar18 & 0xffffffff) << 2);
  (this->Q).queue = puVar12;
  uVar18 = pGVar21->n_vertices;
  (this->SQ).pointer = 0;
  puVar12 = (this->SQ).queue;
  if (puVar12 != (uint *)0x0) {
    operator_delete__(puVar12);
    pGVar21 = (this->super_Solver).game;
  }
  puVar12 = (uint *)operator_new__((uVar18 & 0xffffffff) << 2);
  (this->SQ).queue = puVar12;
  uVar18 = pGVar21->n_vertices;
  (this->Zvec).pointer = 0;
  puVar12 = (this->Zvec).queue;
  if (puVar12 != (uint *)0x0) {
    operator_delete__(puVar12);
    pGVar21 = (this->super_Solver).game;
  }
  puVar12 = (uint *)operator_new__((uVar18 & 0xffffffff) << 2);
  (this->Zvec).queue = puVar12;
  uVar18 = pGVar21->n_vertices;
  (this->tangleto).pointer = 0;
  puVar12 = (this->tangleto).queue;
  if (puVar12 != (uint *)0x0) {
    operator_delete__(puVar12);
    pGVar21 = (this->super_Solver).game;
  }
  puVar12 = (uint *)operator_new__((uVar18 & 0xffffffff) << 2);
  (this->tangleto).queue = puVar12;
  bitset::resize(&this->escapes,pGVar21->n_vertices);
  pGVar21 = (this->super_Solver).game;
  puVar12 = (this->pea_vS).queue;
  uVar18 = pGVar21->n_vertices;
  (this->pea_vS).pointer = 0;
  if (puVar12 != (uint *)0x0) {
    operator_delete__(puVar12);
    pGVar21 = (this->super_Solver).game;
  }
  puVar12 = (uint *)operator_new__((uVar18 & 0xffffffff) << 2);
  (this->pea_vS).queue = puVar12;
  uVar18 = pGVar21->n_vertices;
  (this->pea_iS).pointer = 0;
  puVar12 = (this->pea_iS).queue;
  if (puVar12 != (uint *)0x0) {
    operator_delete__(puVar12);
    pGVar21 = (this->super_Solver).game;
  }
  puVar12 = (uint *)operator_new__((uVar18 & 0xffffffff) << 2);
  (this->pea_iS).queue = puVar12;
  uVar18 = pGVar21->n_vertices;
  (this->pea_S).pointer = 0;
  puVar12 = (this->pea_S).queue;
  if (puVar12 != (uint *)0x0) {
    operator_delete__(puVar12);
    pGVar21 = (this->super_Solver).game;
  }
  puVar12 = (uint *)operator_new__((uVar18 & 0xffffffff) << 2);
  (this->pea_S).queue = puVar12;
  uVar18 = 0xffffffffffffffff;
  if ((ulong)pGVar21->n_vertices < 0x4000000000000000) {
    uVar18 = pGVar21->n_vertices * 4;
  }
  puVar13 = (uint *)operator_new__(uVar18);
  this->pea_vidx = puVar13;
  bitset::resize(&this->pea_root,pGVar21->n_vertices);
  if (this->interleaved != false) {
    do {
      this->iterations = this->iterations + 1;
      sVar16 = 0;
      do {
        iVar25 = 0;
        if ((this->G)._bitssize == sVar16) goto LAB_0017f65b;
        puVar1 = (this->G)._bits + sVar16;
        sVar16 = sVar16 + 1;
      } while (*puVar1 == 0);
      if ((this->super_Solver).trace != 0) {
        poVar14 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,"\x1b[1;38;5;196miteration\x1b[m \x1b[1;36m",0x21);
        poVar14 = (ostream *)std::ostream::operator<<(poVar14,this->iterations + -1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"-even\x1b[m\n",9);
      }
      bVar7 = search(this,0);
      sVar16 = 0;
      do {
        if ((this->G)._bitssize == sVar16) goto LAB_0017f65b;
        puVar1 = (this->G)._bits + sVar16;
        sVar16 = sVar16 + 1;
      } while (*puVar1 == 0);
      if ((this->super_Solver).trace != 0) {
        poVar14 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,"\x1b[1;38;5;196miteration\x1b[m \x1b[1;36m",0x21);
        poVar14 = (ostream *)std::ostream::operator<<(poVar14,this->iterations + -1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"-odd\x1b[m\n",8);
      }
      bVar8 = search(this,1);
    } while (bVar7 || bVar8);
    this_01 = (Error *)__cxa_allocate_exception(0x40);
    Error::Error(this_01,"solver stuck",
                 "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/dtl.cpp"
                 ,0x470);
LAB_0017f8f3:
    __cxa_throw(this_01,&Error::typeinfo,Error::~Error);
  }
  iVar22 = 0;
  do {
    sVar16 = 0;
    do {
      if ((this->G)._bitssize == sVar16) goto LAB_0017f5dc;
      puVar1 = (this->G)._bits + sVar16;
      sVar16 = sVar16 + 1;
    } while (*puVar1 == 0);
    if ((this->super_Solver).trace != 0) {
      poVar14 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar14,"\x1b[1;38;5;196miteration\x1b[m \x1b[1;36m",0x21);
      poVar14 = (ostream *)std::ostream::operator<<(poVar14,this->iterations);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"-even\x1b[m\n",9);
    }
    this->iterations = this->iterations + 1;
    iVar22 = iVar22 + 1;
    bVar7 = search(this,0);
  } while (bVar7);
LAB_0017f5dc:
  iVar25 = 0;
  do {
    sVar16 = 0;
    do {
      if ((this->G)._bitssize == sVar16) goto LAB_0017f65e;
      puVar1 = (this->G)._bits + sVar16;
      sVar16 = sVar16 + 1;
    } while (*puVar1 == 0);
    if ((this->super_Solver).trace != 0) {
      poVar14 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar14,"\x1b[1;38;5;196miteration\x1b[m \x1b[1;36m",0x21);
      poVar14 = (ostream *)std::ostream::operator<<(poVar14,this->iterations);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"-odd\x1b[m\n",8);
    }
    this->iterations = this->iterations + 1;
    iVar25 = iVar25 + 1;
    bVar7 = search(this,1);
  } while (bVar7);
LAB_0017f65e:
  poVar14 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"found ",6);
  poVar14 = (ostream *)std::ostream::operator<<(poVar14,this->dominions);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14," dominions and ",0xf);
  poVar14 = (ostream *)std::ostream::operator<<(poVar14,this->tangles);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14," tangles.\n",10);
  poVar14 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"solved in ",10);
  poVar14 = (ostream *)std::ostream::operator<<(poVar14,this->iterations);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14," iterations and ",0x10);
  poVar14 = (ostream *)std::ostream::operator<<(poVar14,this->steps);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14," pruning steps.\n",0x10);
  poVar14 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"odd iterations: ",0x10);
  plVar15 = (long *)std::ostream::operator<<(poVar14,iVar25);
  std::ios::widen((char)*(undefined8 *)(*plVar15 + -0x18) + (char)plVar15);
  std::ostream::put((char)plVar15);
  std::ostream::flush();
  poVar14 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"even iterations: ",0x11);
  plVar15 = (long *)std::ostream::operator<<(poVar14,iVar22);
  std::ios::widen((char)*(undefined8 *)(*plVar15 + -0x18) + (char)plVar15);
  std::ostream::put((char)plVar15);
  std::ostream::flush();
  uVar18 = ((this->super_Solver).game)->n_vertices;
  if (0 < (long)uVar18) {
    uVar9 = 0;
    do {
      if ((((this->super_Solver).disabled)->_bits[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0) {
        this_01 = (Error *)__cxa_allocate_exception(0x40);
        Error::Error(this_01,"search was incomplete!",
                     "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/dtl.cpp"
                     ,0x47d);
        goto LAB_0017f8f3;
      }
      uVar9 = uVar9 + 1;
    } while (uVar18 != uVar9);
  }
  ppiVar2 = (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppiVar23 = (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppiVar23 != ppiVar2; ppiVar23 = ppiVar23 + 1) {
    if (*ppiVar23 != (int *)0x0) {
      operator_delete__(*ppiVar23);
    }
  }
  ppiVar2 = (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppiVar23 = (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppiVar23 != ppiVar2; ppiVar23 = ppiVar23 + 1) {
    if (*ppiVar23 != (int *)0x0) {
      operator_delete__(*ppiVar23);
    }
  }
  pvVar3 = this->tin;
  if (pvVar3 != (vector<int,_std::allocator<int>_> *)0x0) {
    piVar4 = pvVar3[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    ppiVar24 = &pvVar3[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    if (piVar4 != (pointer)0x0) {
      lVar20 = (long)piVar4 * 0x18;
      do {
        pvVar5 = *(void **)((long)&pvVar3[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar20);
        if (pvVar5 != (void *)0x0) {
          operator_delete(pvVar5,*(long *)((long)ppiVar24 + lVar20) - (long)pvVar5);
        }
        lVar20 = lVar20 + -0x18;
      } while (lVar20 != 0);
    }
    operator_delete__(ppiVar24,(long)piVar4 * 0x18 + 8);
  }
  if (this->str != (int *)0x0) {
    operator_delete__(this->str);
  }
  if (this->pea_vidx != (uint *)0x0) {
    operator_delete__(this->pea_vidx);
  }
  if (this->Candidates != (int *)0x0) {
    operator_delete__(this->Candidates);
  }
  if (this->dvalue == (int *)0x0) {
    return;
  }
  operator_delete__(this->dvalue);
  return;
LAB_0017f65b:
  iVar22 = 0;
  goto LAB_0017f65e;
}

Assistant:

void
DTLSolver::run()
{
    tin = new std::vector<int>[nodecount()];
    str = new int[nodecount()];

    dvalue = new int[nodecount()];

    Z.resize(nodecount());
    S.resize(nodecount());
    W.resize(nodecount());
    G = disabled;
    G.flip();

    Candidates = new int[nodecount()];

    Player.resize(nodecount());
    for (int v=0; v<nodecount(); v++) Player[v] = priority(v)&1;

    Q.resize(nodecount());
    SQ.resize(nodecount());

    Zvec.resize(nodecount());
    tangleto.resize(nodecount());
    escapes.resize(nodecount());

    pea_vS.resize(nodecount());
    pea_iS.resize(nodecount());
    pea_S.resize(nodecount());
    pea_vidx = new unsigned int[nodecount()];
    pea_root.resize(nodecount());

    int even_iterations = 0;
    int odd_iterations = 0;

    if (!interleaved) {
        // First solve for player Odd, then solve for player Even

        while (G.any()) {
            if (trace) logger << "\033[1;38;5;196miteration\033[m \033[1;36m" << iterations << "-even\033[m\n";
            iterations++;
            even_iterations++;
            if (!search(0)) break;
        }

        while (G.any()) {
            if (trace) logger << "\033[1;38;5;196miteration\033[m \033[1;36m" << iterations << "-odd\033[m\n";
            iterations++;
            odd_iterations++;
            if (!search(1)) break;
        }
    } else {
        // Interleave solving for player Even and player Odd

        while (true) {
            iterations++;

            if (!G.any()) break;
            if (trace) logger << "\033[1;38;5;196miteration\033[m \033[1;36m" << iterations-1 << "-even\033[m\n";
            bool found0 = search(0);

            if (!G.any()) break;
            if (trace) logger << "\033[1;38;5;196miteration\033[m \033[1;36m" << iterations-1 << "-odd\033[m\n";
            bool found1 = search(1);

            if (!found0 and !found1) THROW_ERROR("solver stuck");
            
        }
    }

    logger << "found " << dominions << " dominions and "<< tangles << " tangles.\n";
    logger << "solved in " << iterations << " iterations and " << steps << " pruning steps.\n";
    logger << "odd iterations: " << odd_iterations << std::endl;
    logger << "even iterations: " << even_iterations << std::endl;

#ifndef NDEBUG
    // Check if the whole game is now solved
    for (int i=0; i<nodecount(); i++) {
        if (!disabled[i]) { THROW_ERROR("search was incomplete!"); }
    }
#endif

    // Free all explicitly allocated memory
    for (auto &x : tv) delete[] x;
    for (auto &x : tout) delete[] x;
    delete[] tin;
    delete[] str;
    delete[] pea_vidx;
    delete[] Candidates;
    delete[] dvalue;
}